

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O2

string * __thiscall
yactfr::internal::EndReadScopeInstr::_toStr_abi_cxx11_
          (string *__return_storage_ptr__,EndReadScopeInstr *this,Size param_1)

{
  ostream *poVar1;
  Scope scope;
  ostringstream ss;
  allocator local_1f1;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190," ");
  std::__cxx11::string::string((string *)&local_1d0,"scope",&local_1f1);
  _strProp(&local_1b0,&local_1d0);
  poVar1 = std::operator<<(poVar1,(string *)&local_1b0);
  (anonymous_namespace)::scopeStr_abi_cxx11_
            (&local_1f0,(_anonymous_namespace_ *)(ulong)*(uint *)&(this->super_Instr).field_0xc,
             scope);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string EndReadScopeInstr::_toStr(Size) const
{
    std::ostringstream ss;

    ss << " " << _strProp("scope") << scopeStr(_scope) << std::endl;
    return ss.str();
}